

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

void __thiscall re2c::Output::Output(Output *this,char *source_name,char *header_name)

{
  _Rb_tree_header *p_Var1;
  
  OutputFile::OutputFile(&this->source,source_name);
  HeaderFile::HeaderFile(&this->header,header_name);
  p_Var1 = &(this->skeletons)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->skeletons)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->skeletons)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->types).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->skeletons)._M_t._M_impl = 0;
  (this->types).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skeletons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->skeletons)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->skeletons)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->max_fill = 1;
  return;
}

Assistant:

Output::Output (const char * source_name, const char * header_name)
	: source (source_name)
	, header (header_name)
	, types ()
	, skeletons ()
	, max_fill (1)
{}